

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

ssize_t __thiscall kj::InputStream::read(InputStream *this,int __fd,void *__buf,size_t __nbytes)

{
  size_t sVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  size_t *psVar4;
  size_t n;
  Fault f;
  size_t minBytes_local;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  ulong uVar3;
  
  psVar4 = &minBytes_local;
  minBytes_local = __nbytes;
  iVar2 = (*this->_vptr_InputStream[2])();
  sVar1 = minBytes_local;
  uVar3 = CONCAT44(extraout_var,iVar2);
  _kjCondition.left = &n;
  _kjCondition.op.content.ptr = " >= ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = minBytes_local <= uVar3;
  n = uVar3;
  if (!_kjCondition.result) {
    _kjCondition.right = psVar4;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[14]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
               ,0x35,FAILED,"n >= minBytes","_kjCondition,\"Premature EOF\"",&_kjCondition,
               (char (*) [14])"Premature EOF");
    psVar4 = (size_t *)minBytes_local;
    if (minBytes_local - n != 0) {
      memset((void *)(CONCAT44(in_register_00000034,__fd) + n),0,minBytes_local - n);
    }
    kj::_::Debug::Fault::~Fault(&f);
  }
  if (sVar1 <= uVar3) {
    psVar4 = (size_t *)n;
  }
  return (ssize_t)psVar4;
}

Assistant:

size_t InputStream::read(ArrayPtr<byte> buffer, size_t minBytes) {
  size_t n = tryRead(buffer, minBytes);
  KJ_REQUIRE(n >= minBytes, "Premature EOF") {
    // Pretend we read zeros from the input.
    buffer.slice(n).first(minBytes-n).fill(0);
    return minBytes;
  }
  return n;
}